

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void webrtc::FilterFar(int num_partitions,int x_fft_buf_block_pos,float (*x_fft_buf) [2080],
                      float (*h_fft_buf) [2080],float (*y_fft) [65])

{
  int iVar1;
  float fVar2;
  int local_34;
  int pos;
  int xPos;
  int j;
  int i;
  float (*y_fft_local) [65];
  float (*h_fft_buf_local) [2080];
  float (*x_fft_buf_local) [2080];
  int x_fft_buf_block_pos_local;
  int num_partitions_local;
  
  for (xPos = 0; xPos < num_partitions; xPos = xPos + 1) {
    local_34 = (xPos + x_fft_buf_block_pos) * 0x41;
    iVar1 = xPos * 0x41;
    if (num_partitions <= xPos + x_fft_buf_block_pos) {
      local_34 = local_34 + num_partitions * -0x41;
    }
    for (pos = 0; pos < 0x41; pos = pos + 1) {
      fVar2 = MulRe((*x_fft_buf)[local_34 + pos],x_fft_buf[1][local_34 + pos],
                    (*h_fft_buf)[iVar1 + pos],h_fft_buf[1][iVar1 + pos]);
      (*y_fft)[pos] = fVar2 + (*y_fft)[pos];
      fVar2 = MulIm((*x_fft_buf)[local_34 + pos],x_fft_buf[1][local_34 + pos],
                    (*h_fft_buf)[iVar1 + pos],h_fft_buf[1][iVar1 + pos]);
      y_fft[1][pos] = fVar2 + y_fft[1][pos];
    }
  }
  return;
}

Assistant:

static void FilterFar(int num_partitions,
                      int x_fft_buf_block_pos,
                      float x_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
                      float h_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
                      float y_fft[2][PART_LEN1]) {
  int i;
  for (i = 0; i < num_partitions; i++) {
    int j;
    int xPos = (i + x_fft_buf_block_pos) * PART_LEN1;
    int pos = i * PART_LEN1;
    // Check for wrap
    if (i + x_fft_buf_block_pos >= num_partitions) {
      xPos -= num_partitions * (PART_LEN1);
    }

    for (j = 0; j < PART_LEN1; j++) {
      y_fft[0][j] += MulRe(x_fft_buf[0][xPos + j], x_fft_buf[1][xPos + j],
                           h_fft_buf[0][pos + j], h_fft_buf[1][pos + j]);
      y_fft[1][j] += MulIm(x_fft_buf[0][xPos + j], x_fft_buf[1][xPos + j],
                           h_fft_buf[0][pos + j], h_fft_buf[1][pos + j]);
    }
  }
}